

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O1

void __thiscall
Assimp::XFileParser::ParseDataObjectTransformationMatrix(XFileParser *this,aiMatrix4x4 *pMatrix)

{
  ai_real aVar1;
  
  readHeadOfDataObject(this,(string *)0x0);
  aVar1 = ReadFloat(this);
  pMatrix->a1 = aVar1;
  aVar1 = ReadFloat(this);
  pMatrix->b1 = aVar1;
  aVar1 = ReadFloat(this);
  pMatrix->c1 = aVar1;
  aVar1 = ReadFloat(this);
  pMatrix->d1 = aVar1;
  aVar1 = ReadFloat(this);
  pMatrix->a2 = aVar1;
  aVar1 = ReadFloat(this);
  pMatrix->b2 = aVar1;
  aVar1 = ReadFloat(this);
  pMatrix->c2 = aVar1;
  aVar1 = ReadFloat(this);
  pMatrix->d2 = aVar1;
  aVar1 = ReadFloat(this);
  pMatrix->a3 = aVar1;
  aVar1 = ReadFloat(this);
  pMatrix->b3 = aVar1;
  aVar1 = ReadFloat(this);
  pMatrix->c3 = aVar1;
  aVar1 = ReadFloat(this);
  pMatrix->d3 = aVar1;
  aVar1 = ReadFloat(this);
  pMatrix->a4 = aVar1;
  aVar1 = ReadFloat(this);
  pMatrix->b4 = aVar1;
  aVar1 = ReadFloat(this);
  pMatrix->c4 = aVar1;
  aVar1 = ReadFloat(this);
  pMatrix->d4 = aVar1;
  CheckForSemicolon(this);
  CheckForClosingBrace(this);
  return;
}

Assistant:

void XFileParser::ParseDataObjectTransformationMatrix( aiMatrix4x4& pMatrix)
{
    // read header, we're not interested if it has a name
    readHeadOfDataObject();

    // read its components
    pMatrix.a1 = ReadFloat(); pMatrix.b1 = ReadFloat();
    pMatrix.c1 = ReadFloat(); pMatrix.d1 = ReadFloat();
    pMatrix.a2 = ReadFloat(); pMatrix.b2 = ReadFloat();
    pMatrix.c2 = ReadFloat(); pMatrix.d2 = ReadFloat();
    pMatrix.a3 = ReadFloat(); pMatrix.b3 = ReadFloat();
    pMatrix.c3 = ReadFloat(); pMatrix.d3 = ReadFloat();
    pMatrix.a4 = ReadFloat(); pMatrix.b4 = ReadFloat();
    pMatrix.c4 = ReadFloat(); pMatrix.d4 = ReadFloat();

    // trailing symbols
    CheckForSemicolon();
    CheckForClosingBrace();
}